

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkPipelineDiscardRectangleStateCreateInfoEXT *create_info,
          ScratchAllocator *alloc,DynamicStateInfo *dynamic_state_info)

{
  void *__src;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  void *pvVar5;
  size_t size;
  
  puVar4 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x28,0x10);
  if (puVar4 != (undefined8 *)0x0) {
    uVar1 = *(undefined8 *)create_info;
    pvVar5 = create_info->pNext;
    uVar2 = *(undefined8 *)&create_info->flags;
    uVar3 = *(undefined8 *)&create_info->discardRectangleCount;
    puVar4[4] = create_info->pDiscardRectangles;
    puVar4[2] = uVar2;
    puVar4[3] = uVar3;
    *puVar4 = uVar1;
    puVar4[1] = pvVar5;
  }
  if ((dynamic_state_info == (DynamicStateInfo *)0x0) ||
     (dynamic_state_info->discard_rectangle != true)) {
    if ((ulong)*(uint *)(puVar4 + 3) == 0) {
      pvVar5 = (void *)0x0;
    }
    else {
      __src = (void *)puVar4[4];
      size = (ulong)*(uint *)(puVar4 + 3) << 4;
      pvVar5 = ScratchAllocator::allocate_raw(alloc,size,0x10);
      if (pvVar5 != (void *)0x0) {
        memmove(pvVar5,__src,size);
      }
    }
    puVar4[4] = pvVar5;
  }
  else {
    puVar4[4] = 0;
  }
  return puVar4;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkPipelineDiscardRectangleStateCreateInfoEXT *create_info,
                                             ScratchAllocator &alloc,
                                             const DynamicStateInfo *dynamic_state_info)
{
	auto *discard_rectangles = copy(create_info, 1, alloc);
	if (dynamic_state_info && dynamic_state_info->discard_rectangle)
		discard_rectangles->pDiscardRectangles = nullptr;
	else
		discard_rectangles->pDiscardRectangles = copy(discard_rectangles->pDiscardRectangles, discard_rectangles->discardRectangleCount, alloc);
	return discard_rectangles;
}